

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O2

void __thiscall Gluco::Solver::claBumpActivity(Solver *this,Clause *c)

{
  double dVar1;
  float *pfVar2;
  Clause *this_00;
  int i;
  long lVar3;
  float fVar4;
  
  dVar1 = this->cla_inc;
  pfVar2 = Clause::activity(c);
  fVar4 = (float)((double)*pfVar2 + dVar1);
  *pfVar2 = fVar4;
  if (1e+20 < fVar4) {
    for (lVar3 = 0; lVar3 < (this->learnts).sz; lVar3 = lVar3 + 1) {
      this_00 = (Clause *)
                RegionAllocator<unsigned_int>::operator[]
                          (&(this->ca).super_RegionAllocator<unsigned_int>,
                           (this->learnts).data[lVar3]);
      pfVar2 = Clause::activity(this_00);
      *pfVar2 = *pfVar2 * 1e-20;
    }
    this->cla_inc = this->cla_inc * 1e-20;
  }
  return;
}

Assistant:

inline void Solver::claBumpActivity (Clause& c) {
        if ( (c.activity() += cla_inc) > 1e20 ) {
            // Rescale:
            for (int i = 0; i < learnts.size(); i++)
                ca[learnts[i]].activity() *= (float)1e-20;
            cla_inc *= 1e-20; } }